

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O3

int testPermuteShape(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *this_00;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  LayerUnion LVar13;
  unsigned_long *puVar14;
  ostream *poVar15;
  undefined8 *puVar16;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar17;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Arena *pAVar18;
  uint uVar19;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar3 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0015036c:
    pRVar17 = &(local_80.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar1 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0015036c;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar16);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 3;
  }
  uVar19 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar19] = 0x40;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar19] = 0x40;
  }
  uVar19 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar19] = 10;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar19] = 10;
  }
  this->current_size_ = uVar2 + 3;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar3 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00150529:
    pRVar17 = &(local_80.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar1 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00150529;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"output",puVar16);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar18);
  }
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00150623:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar10);
  }
  else {
    iVar1 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00150623;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0015065b:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar1 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0015065b;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar12 = pRVar3->elements[iVar1];
      goto LAB_001506c5;
    }
  }
  pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
LAB_001506c5:
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3bbdaf);
  if (pNVar10->_oneof_case_[0] == 0x136) {
    LVar13 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0x136;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    LVar13.permute_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PermuteLayerParams>
                   (pAVar18);
    (pNVar10->layer_).permute_ = (PermuteLayerParams *)LVar13;
  }
  this_00 = &(LVar13.convolution_)->kernelsize_;
  uVar2 = ((LVar13.convolution_)->kernelsize_).current_size_;
  if (uVar2 == ((LVar13.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar2] = 0;
  }
  else {
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar2] = 0;
  }
  uVar19 = uVar2 + 1;
  ((LVar13.convolution_)->kernelsize_).current_size_ = uVar19;
  if (uVar19 == ((LVar13.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 2);
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar19] = 3;
  }
  else {
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar19] = 3;
  }
  uVar19 = uVar2 + 2;
  ((LVar13.convolution_)->kernelsize_).current_size_ = uVar19;
  if (uVar19 == ((LVar13.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 3);
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar19] = 2;
  }
  else {
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar19] = 2;
  }
  uVar19 = uVar2 + 3;
  ((LVar13.convolution_)->kernelsize_).current_size_ = uVar19;
  if (uVar19 == ((LVar13.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 4);
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar19] = 1;
  }
  else {
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar19] = 1;
  }
  this_00->current_size_ = uVar2 + 4;
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar5 = CoreML::Result::good(&local_50);
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x107);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)!bVar5;
}

Assistant:

int testPermuteShape() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(64);
    shape->add_shape(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();

    // The parameters of the layer don't match the network inputs & outputs
    Specification::NeuralNetworkLayer *permLayer = nn->add_layers();
    permLayer->add_input("input");
    permLayer->add_output("output");
    Specification::PermuteLayerParams *permParams = permLayer->mutable_permute();
    permParams->add_axis(0);
    permParams->add_axis(3);
    permParams->add_axis(2);
    permParams->add_axis(1);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}